

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbordiagnostic.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_953179::DiagnosticNotation::~DiagnosticNotation(DiagnosticNotation *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->result).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->separator).d);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)this);
  return;
}

Assistant:

static QString create(const QCborValue &v, QCborValue::DiagnosticNotationOptions opts)
    {
        DiagnosticNotation dn(opts);
        dn.appendValue(v);
        return dn.result;
    }